

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

QString * Qt::Literals::StringLiterals::operator____s
                    (QString *__return_storage_ptr__,char16_t *str,size_t size)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).ptr = str;
  local_28.size = 0;
  (__return_storage_ptr__->d).size = size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QString operator""_s(const char16_t *str, size_t size) noexcept
{
    return QString(QStringPrivate(nullptr, const_cast<char16_t *>(str), qsizetype(size)));
}